

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertNodes
          (FBXConverter *this,uint64_t id,aiNode *parent,aiMatrix4x4 *parent_transform)

{
  pointer *pppaVar1;
  Connection *this_00;
  Document *this_01;
  undefined1 auVar2 [16];
  bool bVar3;
  size_type sVar4;
  reference ppCVar5;
  long lVar6;
  Object *pOVar7;
  aiNode *paVar8;
  reference ppaVar9;
  uint64_t uVar10;
  reference ppaVar11;
  pointer ppaVar12;
  ImportSettings *pIVar13;
  ulong __n;
  aiNode **__s;
  iterator iVar14;
  iterator iVar15;
  Model *local_270;
  delete_fun<aiNode> deleter_1;
  exception *anon_var_0;
  delete_fun<aiNode> deleter;
  aiNode *postnode;
  iterator __end5;
  iterator __begin5;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *__range5;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_178;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *child_conns;
  aiNode *prenode;
  iterator __end4;
  iterator __begin4;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *__range4;
  aiNode *last_parent;
  byte local_139;
  undefined1 local_138 [7];
  bool need_additional_node;
  string unique_name;
  aiMatrix4x4 new_abs_transform;
  Model *model;
  Object *object;
  Connection *con;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<aiNode_*,_std::allocator<aiNode_*>_> post_nodes_chain;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes_chain;
  undefined1 local_60 [8];
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  aiMatrix4x4 *parent_transform_local;
  aiNode *parent_local;
  uint64_t id_local;
  FBXConverter *this_local;
  
  pppaVar1 = &nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)pppaVar1,this->doc,id,"Model");
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_60);
  sVar4 = std::
          vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ::size((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  *)pppaVar1);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::reserve
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_60,sVar4);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
             &post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range2);
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    *)pppaVar1);
  con = (Connection *)
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        end((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             *)pppaVar1);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                *)&con);
    if (!bVar3) {
      sVar4 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_60);
      if (sVar4 != 0) {
        sVar4 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                          ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_60);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = sVar4;
        __n = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          __n = 0xffffffffffffffff;
        }
        __s = (aiNode **)operator_new__(__n);
        memset(__s,0,__n);
        parent->mChildren = __s;
        sVar4 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                          ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_60);
        parent->mNumChildren = (uint)sVar4;
        iVar14 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::begin
                           ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_60);
        iVar15 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::end
                           ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_60);
        std::
        swap_ranges<__gnu_cxx::__normal_iterator<aiNode**,std::vector<aiNode*,std::allocator<aiNode*>>>,aiNode**>
                  ((__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>)
                   iVar14._M_current,
                   (__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>)
                   iVar15._M_current,parent->mChildren);
      }
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
                ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range2);
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
                ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                 &post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
                ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_60);
      std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 *)&nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      return;
    }
    ppCVar5 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppCVar5;
    Connection::PropertyName_abi_cxx11_(this_00);
    lVar6 = std::__cxx11::string::length();
    if (lVar6 == 0) {
      pOVar7 = Connection::SourceObject(this_00);
      if (pOVar7 == (Object *)0x0) {
        LogFunctions<Assimp::FBXImporter>::LogWarn("failed to convert source object for Model link")
        ;
      }
      else {
        if (pOVar7 == (Object *)0x0) {
          local_270 = (Model *)0x0;
        }
        else {
          local_270 = (Model *)__dynamic_cast(pOVar7,&Object::typeinfo,&Model::typeinfo,0);
        }
        if (local_270 != (Model *)0x0) {
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::clear
                    ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                     &post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::clear
                    ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range2);
          unique_name.field_2._8_4_ = parent_transform->a1;
          unique_name.field_2._12_4_ = parent_transform->a2;
          MakeUniqueNodeName_abi_cxx11_((string *)local_138,this,local_270,parent);
          local_139 = GenerateTransformationNodeChain
                                (this,local_270,(string *)local_138,
                                 (vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                                 &post_nodes_chain.
                                  super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,
                                 (vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range2);
          sVar4 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                             &post_nodes_chain.
                              super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          if (sVar4 == 0) {
            __assert_fail("nodes_chain.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                          ,0xde,
                          "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                         );
          }
          if ((local_139 & 1) != 0) {
            paVar8 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar8,(string *)local_138);
            last_parent = paVar8;
            std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                      ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                       &post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,&last_parent);
          }
          ppaVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::back
                              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                               &post_nodes_chain.
                                super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
          SetupNodeMetadata(this,local_270,*ppaVar9);
          pppaVar1 = &post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          __end4 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::begin
                             ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)pppaVar1);
          prenode = (aiNode *)
                    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::end
                              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)pppaVar1);
          __range4 = (vector<aiNode_*,_std::allocator<aiNode_*>_> *)parent;
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                                             *)&prenode), bVar3) {
            ppaVar11 = __gnu_cxx::
                       __normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                       ::operator*(&__end4);
            child_conns = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                           *)*ppaVar11;
            if ((aiNode *)child_conns == (aiNode *)0x0) {
              __assert_fail("prenode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xea,
                            "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                           );
            }
            if ((aiNode *)__range4 != parent) {
              *(undefined4 *)
               &__range4[0x2e].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_start = 1;
              ppaVar12 = (pointer)operator_new__(8);
              __range4[0x2e].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish = ppaVar12;
              *__range4[0x2e].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish = (aiNode *)child_conns;
            }
            child_conns[0x2d].
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__range4;
            __range4 = (vector<aiNode_*,_std::allocator<aiNode_*>_> *)child_conns;
            aiMatrix4x4t<float>::operator*=
                      ((aiMatrix4x4t<float> *)((long)&unique_name.field_2 + 8),
                       (aiMatrix4x4t<float> *)
                       ((long)&child_conns[0x2a].
                               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
            __gnu_cxx::
            __normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>::
            operator++(&__end4);
          }
          ppaVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::back
                              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                               &post_nodes_chain.
                                super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
          ConvertModel(this,local_270,*ppaVar9,(aiMatrix4x4 *)((long)&unique_name.field_2 + 8));
          this_01 = this->doc;
          uVar10 = Object::ID(&local_270->super_Object);
          Document::GetConnectionsByDestinationSequenced
                    ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                      *)&__range5,this_01,uVar10,"Model");
          local_178 = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                       *)&__range5;
          sVar4 = std::
                  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ::size(local_178);
          if (sVar4 == 0) {
            iVar14 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::begin
                               ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range2);
            iVar15 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::end
                               ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range2);
            std::
            for_each<__gnu_cxx::__normal_iterator<aiNode**,std::vector<aiNode*,std::allocator<aiNode*>>>,Assimp::FBX::Util::delete_fun<aiNode>>
                      (iVar14._M_current,iVar15._M_current);
          }
          else {
            __end5 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::begin
                               ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range2);
            postnode = (aiNode *)
                       std::vector<aiNode_*,_std::allocator<aiNode_*>_>::end
                                 ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range2);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                                               *)&postnode), bVar3) {
              ppaVar11 = __gnu_cxx::
                         __normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>
                         ::operator*(&__end5);
              paVar8 = *ppaVar11;
              if (paVar8 == (aiNode *)0x0) {
                __assert_fail("postnode",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                              ,0x103,
                              "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                             );
              }
              if ((aiNode *)__range4 != parent) {
                *(undefined4 *)
                 &__range4[0x2e].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start = 1;
                ppaVar12 = (pointer)operator_new__(8);
                __range4[0x2e].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish = ppaVar12;
                *__range4[0x2e].super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish = paVar8;
              }
              paVar8->mParent = (aiNode *)__range4;
              aiMatrix4x4t<float>::operator*=
                        ((aiMatrix4x4t<float> *)((long)&unique_name.field_2 + 8),
                         &paVar8->mTransformation);
              __gnu_cxx::
              __normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>::
              operator++(&__end5);
              __range4 = (vector<aiNode_*,_std::allocator<aiNode_*>_> *)paVar8;
            }
          }
          uVar10 = Object::ID(&local_270->super_Object);
          ConvertNodes(this,uVar10,(aiNode *)__range4,
                       (aiMatrix4x4 *)((long)&unique_name.field_2 + 8));
          pIVar13 = Document::Settings(this->doc);
          if ((pIVar13->readLights & 1U) != 0) {
            ConvertLights(this,local_270,(string *)local_138);
          }
          pIVar13 = Document::Settings(this->doc);
          if ((pIVar13->readCameras & 1U) != 0) {
            ConvertCameras(this,local_270,(string *)local_138);
          }
          ppaVar9 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::front
                              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                               &post_nodes_chain.
                                super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                    ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_60,ppaVar9);
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::clear
                    ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                     &post_nodes_chain.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ::~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                     *)&__range5);
          std::__cxx11::string::~string((string *)local_138);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void FBXConverter::ConvertNodes(uint64_t id, aiNode& parent, const aiMatrix4x4& parent_transform) {
            const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(id, "Model");

            std::vector<aiNode*> nodes;
            nodes.reserve(conns.size());

            std::vector<aiNode*> nodes_chain;
            std::vector<aiNode*> post_nodes_chain;

            try {
                for (const Connection* con : conns) {

                    // ignore object-property links
                    if (con->PropertyName().length()) {
                        continue;
                    }

                    const Object* const object = con->SourceObject();
                    if (nullptr == object) {
                        FBXImporter::LogWarn("failed to convert source object for Model link");
                        continue;
                    }

                    const Model* const model = dynamic_cast<const Model*>(object);

                    if (nullptr != model) {
                        nodes_chain.clear();
                        post_nodes_chain.clear();

                        aiMatrix4x4 new_abs_transform = parent_transform;

                        std::string unique_name = MakeUniqueNodeName(model, parent);

                        // even though there is only a single input node, the design of
                        // assimp (or rather: the complicated transformation chain that
                        // is employed by fbx) means that we may need multiple aiNode's
                        // to represent a fbx node's transformation.
                        const bool need_additional_node = GenerateTransformationNodeChain(*model, unique_name, nodes_chain, post_nodes_chain);

                        ai_assert(nodes_chain.size());

                        if (need_additional_node) {
                            nodes_chain.push_back(new aiNode(unique_name));
                        }

                        //setup metadata on newest node
                        SetupNodeMetadata(*model, *nodes_chain.back());

                        // link all nodes in a row
                        aiNode* last_parent = &parent;
                        for (aiNode* prenode : nodes_chain) {
                            ai_assert(prenode);

                            if (last_parent != &parent) {
                                last_parent->mNumChildren = 1;
                                last_parent->mChildren = new aiNode*[1];
                                last_parent->mChildren[0] = prenode;
                            }

                            prenode->mParent = last_parent;
                            last_parent = prenode;

                            new_abs_transform *= prenode->mTransformation;
                        }

                        // attach geometry
                        ConvertModel(*model, *nodes_chain.back(), new_abs_transform);

                        // check if there will be any child nodes
                        const std::vector<const Connection*>& child_conns
                            = doc.GetConnectionsByDestinationSequenced(model->ID(), "Model");

                        // if so, link the geometric transform inverse nodes
                        // before we attach any child nodes
                        if (child_conns.size()) {
                            for (aiNode* postnode : post_nodes_chain) {
                                ai_assert(postnode);

                                if (last_parent != &parent) {
                                    last_parent->mNumChildren = 1;
                                    last_parent->mChildren = new aiNode*[1];
                                    last_parent->mChildren[0] = postnode;
                                }

                                postnode->mParent = last_parent;
                                last_parent = postnode;

                                new_abs_transform *= postnode->mTransformation;
                            }
                        }
                        else {
                            // free the nodes we allocated as we don't need them
                            Util::delete_fun<aiNode> deleter;
                            std::for_each(
                                post_nodes_chain.begin(),
                                post_nodes_chain.end(),
                                deleter
                            );
                        }

                        // attach sub-nodes (if any)
                        ConvertNodes(model->ID(), *last_parent, new_abs_transform);

                        if (doc.Settings().readLights) {
                            ConvertLights(*model, unique_name);
                        }

                        if (doc.Settings().readCameras) {
                            ConvertCameras(*model, unique_name);
                        }

                        nodes.push_back(nodes_chain.front());
                        nodes_chain.clear();
                    }
                }

                if (nodes.size()) {
                    parent.mChildren = new aiNode*[nodes.size()]();
                    parent.mNumChildren = static_cast<unsigned int>(nodes.size());

                    std::swap_ranges(nodes.begin(), nodes.end(), parent.mChildren);
                }
            }
            catch (std::exception&) {
                Util::delete_fun<aiNode> deleter;
                std::for_each(nodes.begin(), nodes.end(), deleter);
                std::for_each(nodes_chain.begin(), nodes_chain.end(), deleter);
                std::for_each(post_nodes_chain.begin(), post_nodes_chain.end(), deleter);
            }
        }